

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O2

char * google::protobuf::internal::TcParser::
       GenericFallbackImpl<google::protobuf::Message,google::protobuf::UnknownFieldSet>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint *puVar1;
  ExtensionSet *this;
  char *pcVar2;
  UnknownFieldSet *unknown;
  uint uVar3;
  
  if (ptr == (char *)0x0) {
    ptr = (char *)&GenericFallbackImpl<google::protobuf::Message,_google::protobuf::UnknownFieldSet>
                   ::kOps;
  }
  else {
    if ((ulong)table->has_bits_offset != 0) {
      puVar1 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar1 = *puVar1 | (uint)hasbits;
    }
    uVar3 = data.field_0._0_4_;
    if (uVar3 != 0 && (uVar3 & 7) != 4) {
      if ((ulong)table->extension_offset != 0) {
        this = RefAt<google::protobuf::internal::ExtensionSet>(msg,(ulong)table->extension_offset);
        pcVar2 = ExtensionSet::ParseField
                           (this,(ulong)data.field_0 & 0xffffffff,ptr,
                            (Message *)table->class_data->prototype,&msg->_internal_metadata_,ctx);
        return pcVar2;
      }
      unknown = InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                          (&msg->_internal_metadata_);
      pcVar2 = UnknownFieldParse((ulong)data.field_0 & 0xffffffff,unknown,ptr,ctx);
      return pcVar2;
    }
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar3 - 1;
  }
  return (char *)(UnknownFieldOps *)ptr;
}

Assistant:

PROTOBUF_CC static const char* GenericFallbackImpl(PROTOBUF_TC_PARAM_DECL) {
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
      // This is the ABI used by GetUnknownFieldOps(). Return the vtable.
      static constexpr UnknownFieldOps kOps = {
          WriteVarintToUnknown<UnknownFieldsT>,
          WriteLengthDelimitedToUnknown<UnknownFieldsT>};
      return reinterpret_cast<const char*>(&kOps);
    }

    SyncHasbits(msg, hasbits, table);
    uint32_t tag = data.tag();
    if ((tag & 7) == WireFormatLite::WIRETYPE_END_GROUP || tag == 0) {
      ctx->SetLastTag(tag);
      return ptr;
    }

    if (table->extension_offset != 0) {
      // We don't need to check the extension ranges. If it is not an extension
      // it will be handled just like if it was an unknown extension: sent to
      // the unknown field set.
      return RefAt<ExtensionSet>(msg, table->extension_offset)
          .ParseField(
              tag, ptr,
              static_cast<const MessageBaseT*>(table->default_instance()),
              &msg->_internal_metadata_, ctx);
    } else {
      // Otherwise, we directly put it on the unknown field set.
      return UnknownFieldParse(
          tag,
          msg->_internal_metadata_.mutable_unknown_fields<UnknownFieldsT>(),
          ptr, ctx);
    }
  }